

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.hxx
# Opt level: O3

const_iterator __thiscall
cmsys::
hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::begin(hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
        *this)

{
  pointer pp_Var1;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var2;
  long lVar3;
  long lVar4;
  const_iterator cVar5;
  
  pp_Var1 = (this->_M_ht)._M_buckets.
            super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->_M_ht)._M_buckets.
                super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    do {
      p_Var2 = pp_Var1[lVar4];
      if (p_Var2 != (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0) goto LAB_00117b1a;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  p_Var2 = (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0;
LAB_00117b1a:
  cVar5._M_ht = &this->_M_ht;
  cVar5._M_cur = p_Var2;
  return cVar5;
}

Assistant:

const_iterator begin() const { return _M_ht.begin(); }